

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  double dVar1;
  long lVar2;
  long lVar3;
  Scalar *pSVar4;
  SrcEvaluatorType *pSVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  Index row;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  Index col;
  long col_00;
  Index inner;
  long lVar14;
  CoeffReturnType CVar15;
  Scalar SVar16;
  Scalar SVar17;
  
  lVar2 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  if (0 < lVar2) {
    lVar3 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows;
    lVar13 = 0;
    lVar10 = 0;
    col_00 = 0;
    do {
      if (0 < lVar10) {
        pSVar4 = (kernel->m_dst->
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ).m_data;
        lVar14 = (kernel->m_dst->
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ).m_outerStride.m_value;
        CVar15 = product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ::coeff(&kernel->m_src->
                          super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         ,0,col_00);
        pSVar4[lVar14 * col_00] = CVar15;
      }
      uVar7 = lVar3 - lVar10 & 0xfffffffffffffffe;
      lVar14 = uVar7 + lVar10;
      if (0 < (long)uVar7) {
        lVar8 = lVar10 * 8;
        lVar9 = lVar10;
        do {
          pSVar5 = kernel->m_src;
          lVar6 = (pSVar5->
                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  ).m_innerDim;
          if (lVar6 < 1) {
            SVar16 = 0.0;
            SVar17 = 0.0;
          }
          else {
            pdVar11 = (double *)
                      ((long)(pSVar5->
                             super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             ).m_lhsImpl.
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             .m_data + lVar8);
            SVar16 = 0.0;
            SVar17 = 0.0;
            lVar12 = 0;
            do {
              dVar1 = *(double *)
                       ((long)(pSVar5->
                              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                              ).m_rhsImpl.
                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                              .m_data +
                       lVar12 * 8 +
                       (pSVar5->
                       super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       ).m_rhsImpl.
                       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       .m_outerStride.m_value * lVar13);
              SVar16 = SVar16 + dVar1 * *pdVar11;
              SVar17 = SVar17 + dVar1 * pdVar11[1];
              lVar12 = lVar12 + 1;
              pdVar11 = pdVar11 + (pSVar5->
                                  super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                                  ).m_lhsImpl.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  .m_outerStride.m_value;
            } while (lVar6 != lVar12);
          }
          pSVar4 = (kernel->m_dst->
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ).m_data +
                   (kernel->m_dst->
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ).m_outerStride.m_value * col_00 + lVar9;
          *pSVar4 = SVar16;
          pSVar4[1] = SVar17;
          lVar9 = lVar9 + 2;
          lVar8 = lVar8 + 0x10;
        } while (lVar9 < lVar14);
      }
      for (; lVar14 < lVar3; lVar14 = lVar14 + 1) {
        lVar8 = (kernel->m_dst->
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>)
                .m_outerStride.m_value;
        pSVar4 = (kernel->m_dst->
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ).m_data;
        CVar15 = product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ::coeff(&kernel->m_src->
                          super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                         ,lVar14,col_00);
        *(CoeffReturnType *)((long)pSVar4 + lVar14 * 8 + lVar8 * lVar13) = CVar15;
      }
      lVar10 = (long)(lVar10 + (ulong)((uint)lVar3 & 1)) % 2;
      if (lVar3 < lVar10) {
        lVar10 = lVar3;
      }
      col_00 = col_00 + 1;
      lVar13 = lVar13 + 8;
    } while (col_00 != lVar2);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC const Scalar* dstDataPtr() const
  {
    return m_dstExpr.data();
  }